

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDEdgeSharpness __thiscall
ON_SubDEdge::SubdivideSharpness(ON_SubDEdge *this,ON_SubDVertex *end_vertex,bool bReverse)

{
  ON_SubDEdgeSharpness OVar1;
  
  if (end_vertex != (ON_SubDVertex *)0x0) {
    if (this->m_vertex[0] == end_vertex) {
      OVar1 = SubdivideSharpness(this,0,bReverse);
      return (ON_SubDEdgeSharpness)OVar1.m_edge_sharpness;
    }
    if (this->m_vertex[1] == end_vertex) {
      OVar1 = SubdivideSharpness(this,1,bReverse);
      return (ON_SubDEdgeSharpness)OVar1.m_edge_sharpness;
    }
  }
  return (ON_SubDEdgeSharpness)(float  [2])0x0;
}

Assistant:

const ON_SubDEdgeSharpness ON_SubDEdge::SubdivideSharpness(
  const class ON_SubDVertex* end_vertex,
  bool bReverse
) const
{
  if (nullptr != end_vertex)
  {
    if (end_vertex == this->m_vertex[0])
      return this->SubdivideSharpness(0U, bReverse);
    if (end_vertex == this->m_vertex[1])
      return this->SubdivideSharpness(1U, bReverse);
  }
  return ON_SubDEdgeSharpness::Smooth;
}